

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O2

void flatcc_json_printer_string_vector_field
               (flatcc_json_printer_t *ctx,flatcc_json_printer_table_descriptor_t *td,int id,
               char *name,size_t len)

{
  char *pcVar1;
  uint *puVar2;
  int iVar3;
  ulong uVar4;
  uint *puVar5;
  bool bVar6;
  
  puVar2 = (uint *)get_field_ptr(td,id);
  if (puVar2 != (uint *)0x0) {
    iVar3 = td->count;
    td->count = iVar3 + 1;
    if (iVar3 != 0) {
      pcVar1 = ctx->p;
      ctx->p = pcVar1 + 1;
      *pcVar1 = ',';
    }
    uVar4 = (ulong)*puVar2;
    iVar3 = *(int *)((long)puVar2 + uVar4);
    print_name(ctx,name,len);
    ctx->level = ctx->level + 1;
    pcVar1 = ctx->p;
    ctx->p = pcVar1 + 1;
    *pcVar1 = '[';
    if (iVar3 == 0) {
      iVar3 = 0;
    }
    else {
      puVar5 = (uint *)((long)puVar2 + uVar4 + 4);
      if (ctx->indent == '\0') {
        flatcc_json_printer_flush_partial(ctx);
      }
      else {
        pcVar1 = ctx->p;
        ctx->p = pcVar1 + 1;
        *pcVar1 = '\n';
        print_indent(ctx);
      }
      print_string_object(ctx,(void *)((ulong)*puVar5 + (long)puVar5));
      iVar3 = iVar3 + -1;
    }
    puVar2 = (uint *)((long)puVar2 + uVar4 + 8);
    while (bVar6 = iVar3 != 0, iVar3 = iVar3 + -1, bVar6) {
      pcVar1 = ctx->p;
      ctx->p = pcVar1 + 1;
      *pcVar1 = ',';
      if (ctx->indent == '\0') {
        flatcc_json_printer_flush_partial(ctx);
      }
      else {
        pcVar1 = ctx->p;
        ctx->p = pcVar1 + 1;
        *pcVar1 = '\n';
        print_indent(ctx);
      }
      print_string_object(ctx,(void *)((ulong)*puVar2 + (long)puVar2));
      puVar2 = puVar2 + 1;
    }
    if (ctx->indent != '\0') {
      pcVar1 = ctx->p;
      ctx->p = pcVar1 + 1;
      *pcVar1 = '\n';
      ctx->level = ctx->level + -1;
      print_indent(ctx);
    }
    pcVar1 = ctx->p;
    ctx->p = pcVar1 + 1;
    *pcVar1 = ']';
  }
  return;
}

Assistant:

void flatcc_json_printer_string_vector_field(flatcc_json_printer_t *ctx,
        flatcc_json_printer_table_descriptor_t *td,
        int id, const char *name, size_t len)
{
    const uoffset_t *p = get_field_ptr(td, id);
    uoffset_t count;

    if (p) {
        if (td->count++) {
            print_char(',');
        }
        p = read_uoffset_ptr(p);
        count = __flatbuffers_uoffset_read_from_pe(p);
        ++p;
        print_name(ctx, name, len);
        print_start('[');
        if (count) {
            print_nl();
            print_string_object(ctx, read_uoffset_ptr(p));
            --count;
        }
        while (count--) {
            ++p;
            print_char(',');
            print_nl();
            print_string_object(ctx, read_uoffset_ptr(p));
        }
        print_end(']');
    }
}